

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

Program * UnifiedRegex::Program::New(Recycler *recycler,RegexFlags flags)

{
  Recycler *alloc;
  Program *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_a63c962;
  data.filename._0_4_ = 0x162b;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_40);
  this = (Program *)new<Memory::Recycler>(0x38,alloc,0x37a1d4);
  Program(this,flags);
  return this;
}

Assistant:

Program *Program::New(Recycler *recycler, RegexFlags flags)
    {
        return RecyclerNew(recycler, Program, flags);
    }